

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_midi.c
# Opt level: O2

void inmidi_controlchange(int portno,int channel,int ctlnumber,int value)

{
  t_atom at [3];
  
  if (*(t_pd **)(*(long *)(pd_maininstance.pd_midi + 0x18) + 8) != (t_pd *)0x0) {
    at[0].a_type = A_FLOAT;
    at[0].a_w._0_4_ = (undefined4)ctlnumber;
    at[1].a_w._0_4_ = (undefined4)value;
    at[2].a_w._0_4_ = (undefined4)(portno * 0x10 + channel + 1);
    at[1].a_type = at[0].a_type;
    at[2].a_type = at[0].a_type;
    pd_list(*(t_pd **)(*(long *)(pd_maininstance.pd_midi + 0x18) + 8),&s_list,3,at);
  }
  return;
}

Assistant:

void inmidi_controlchange(int portno, int channel, int ctlnumber, int value)
{
    if (pd_this->pd_midi->m_ctlin_sym->s_thing)
    {
        t_atom at[3];
        SETFLOAT(at, ctlnumber);
        SETFLOAT(at+1, value);
        SETFLOAT(at+2, (channel + (portno << 4) + 1));
        pd_list(pd_this->pd_midi->m_ctlin_sym->s_thing, &s_list, 3, at);
    }
}